

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

uint GetNextFuzzyBits(uchar *buffer,uint offset_begin,uint offset_end,bool bSearchForFuzzy)

{
  uint uStack_1c;
  bool bSearchForFuzzy_local;
  uint offset_end_local;
  uint offset_begin_local;
  uchar *buffer_local;
  
  uStack_1c = offset_begin;
  do {
    if (offset_end <= uStack_1c) {
      return 0xffffffff;
    }
    if (bSearchForFuzzy) {
      if ((buffer[uStack_1c] & 4) != 0) {
        return uStack_1c;
      }
    }
    else if ((buffer[uStack_1c] & 4) == 0) {
      return uStack_1c;
    }
    uStack_1c = uStack_1c + 1;
  } while( true );
}

Assistant:

unsigned int GetNextFuzzyBits(unsigned char* buffer, unsigned int offset_begin, unsigned int offset_end,
                              bool bSearchForFuzzy)
{
   //
   while (offset_begin < offset_end)
   {
      if (bSearchForFuzzy)
      {
         if (buffer[offset_begin] & BIT_WEAK)
         {
            // Found !
            return offset_begin;
         }
      }
      else
      {
         if ((buffer[offset_begin] & BIT_WEAK) == 0)
         {
            // Found !
            return offset_begin;
         }
      }

      offset_begin++;
   }
   return -1;
}